

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O3

void window_copy(Am_Object *window)

{
  Am_Object *this;
  Am_Object local_20;
  
  Am_Object::Set(window,0x7d2,0,0);
  this = (Am_Object *)operator_new(0x30);
  this->data = (Am_Object_Data *)0x0;
  Am_Object::operator=(this,window);
  this[1].data = (Am_Object_Data *)0x0;
  this[3].data = (Am_Object_Data *)0x0;
  this[4].data = (Am_Object_Data *)0x0;
  this[5].data = (Am_Object_Data *)0x0;
  Am_Object::Add(window,0x7d6,this,0);
  Am_Object::Am_Object(&local_20,window);
  am_generic_renew_copied_comp(&local_20);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

static void
window_copy(Am_Object window)
{
  window.Set(Am_DRAWONABLE, (0L));
  Am_Window_ToDo *win_todo = new Am_Window_ToDo;
  win_todo->window = window;
  win_todo->width = 0;
  win_todo->height = 0;
  win_todo->flags = 0;
  win_todo->prev = nullptr;
  win_todo->next = nullptr;
  window.Add(Am_TODO, (Am_Ptr)win_todo);
  am_generic_renew_copied_comp(window);

  //// NDY: window might be created as a part already (currently doesn't matter)
}